

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Choice(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  Gia_Man_t *pNew;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  Cec_ParChc_t Pars;
  Cec_ParChc_t local_54;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Cec_ManChcSetDefaultParams(&local_54);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Ccvh"), pAbc_00 = local_38, iVar5 = globalUtilOptind,
          0x62 < iVar1) {
      piVar2 = &local_54.fUseCSat;
      if (iVar1 != 99) {
        if (iVar1 != 0x76) goto LAB_00280bbd;
        piVar2 = &local_54.fVerbose;
      }
      *(byte *)piVar2 = (byte)*piVar2 ^ 1;
    }
    if (iVar1 != 0x43) {
      if (iVar1 == -1) {
        if (local_38->pGia != (Gia_Man_t *)0x0) {
          pNew = Cec_ManChoiceComputation(local_38->pGia,&local_54);
          Abc_FrameUpdateGia(pAbc_00,pNew);
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9Choice(): There is no AIG.\n";
        iVar5 = -1;
        goto LAB_00280c52;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    local_54.nBTLimit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
  } while (-1 < local_54.nBTLimit);
LAB_00280bbd:
  Abc_Print(-2,"usage: &choice [-C num] [-cvh]\n");
  Abc_Print(-2,"\t         performs computation of structural choices\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_54.nBTLimit);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (local_54.fUseCSat == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar3);
  if (local_54.fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar5 = -2;
LAB_00280c52:
  Abc_Print(iVar5,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Choice( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParChc_t Pars, * pPars = &Pars;
    Gia_Man_t * pTemp;
    int c;
    Cec_ManChcSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ccvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Choice(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Cec_ManChoiceComputation( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &choice [-C num] [-cvh]\n" );
    Abc_Print( -2, "\t         performs computation of structural choices\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}